

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

ExecutionModel __thiscall spirv_cross::Compiler::get_execution_model(Compiler *this)

{
  SPIREntryPoint *pSVar1;
  
  pSVar1 = get_entry_point(this);
  return pSVar1->model;
}

Assistant:

ExecutionModel Compiler::get_execution_model() const
{
	auto &execution = get_entry_point();
	return execution.model;
}